

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::Tex2DShader::~Tex2DShader(Tex2DShader *this)

{
  sglr::ShaderProgram::~ShaderProgram(&this->super_ShaderProgram);
  operator_delete(this,0x158);
  return;
}

Assistant:

Tex2DShader (void)
		: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::Uniform("u_sampler0", glu::TYPE_SAMPLER_2D)
					<< sglr::pdec::VertexSource("attribute highp vec4 a_position;\n"
												"attribute mediump vec2 a_coord;\n"
												"varying mediump vec2 v_coord;\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = a_position;\n"
												"	v_coord = a_coord;\n"
												"}\n")
					<< sglr::pdec::FragmentSource("uniform sampler2D u_sampler0;\n"
												  "varying mediump vec2 v_coord;\n"
												  "void main (void)\n"
												  "{\n"
												  "	gl_FragColor = texture2D(u_sampler0, v_coord);\n"
												  "}\n"))
	{
	}